

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O2

bool __thiscall Kernel::Term::computable(Term *this)

{
  ulong uVar1;
  bool bVar2;
  SubtermIterator sit;
  SubtermIterator local_40;
  
  if ((*(byte *)(*(long *)(*(long *)(DAT_00a14190 + 0x60) + (ulong)this->_functor * 8) + 0x42) &
      0x10) == 0) {
    bVar2 = false;
  }
  else {
    SubtermIterator::SubtermIterator(&local_40,this);
    while( true ) {
      bVar2 = SubtermIterator::hasNext(&local_40);
      if (!bVar2) break;
      local_40._used = true;
      uVar1 = **(ulong **)
                (*(long *)((long)local_40._stack._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                 .
                                 super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>
                                 ._M_head_impl + 0x10) + -8);
      if (((uVar1 & 3) != 0) ||
         ((*(byte *)(*(long *)(*(long *)(DAT_00a14190 + 0x60) + (ulong)*(uint *)(uVar1 + 8) * 8) +
                    0x42) & 0x10) == 0)) break;
    }
    bVar2 = !bVar2;
    SubtermIterator::~SubtermIterator(&local_40);
  }
  return bVar2;
}

Assistant:

bool Term::computable() const {
  if (!env.signature->getFunction(this->functor())->computable()) {
    return false;
  }
  SubtermIterator sit(this);
  while (sit.hasNext()) {
    TermList t = sit.next();
    if (!t.isTerm() || !env.signature->getFunction(t.term()->functor())->computable()) {
      return false;
    }
  }
  return true;
}